

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialNormalizer.cpp
# Opt level: O3

Option<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
* __thiscall
Kernel::normalizeDiv<Kernel::NumTraits<Kernel::RealConstantType>>
          (Option<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
           *__return_storage_ptr__,Kernel *this,NormalizationResult *lhs,NormalizationResult *rhs,
          bool *simplfied)

{
  long lVar1;
  bool bVar2;
  char *pcVar3;
  NormalizationResult inv;
  RealConstantType RStack_f8;
  RealConstantType local_d8;
  RealConstantType local_b8;
  NormalizationResult local_98;
  NormalizationResult local_64;
  
  if (((undefined1  [52])
       ((undefined1  [52])
        (lhs->_inner).
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
        .
        super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
       & (undefined1  [52])0x7) != (undefined1  [52])0x3) &&
     (lVar1 = *(long *)((lhs->_inner).
                        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                        .
                        super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                        ._content + 0x20), *(long *)(lVar1 + 0x10) == *(long *)(lVar1 + 8))) {
    pcVar3 = (lhs->_inner).
             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             .
             super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
             ._content;
    RealConstantType::RealConstantType(&local_b8,(RealConstantType *)pcVar3);
    local_64._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    .
    super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
    ._0_1_ = 0;
    local_64._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    .
    super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
    ._content[0] = '\0';
    local_64._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    .
    super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
    ._content[1] = '\0';
    local_64._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    .
    super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
    ._content[2] = '\0';
    bVar2 = operator!=(&local_b8,(int *)&local_64);
    mpz_clear(local_b8.super_RationalConstantType._den._val);
    mpz_clear((__mpz_struct *)&local_b8);
    if (bVar2) {
      local_98._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      .
      super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
      ._0_1_ = 1;
      local_98._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      .
      super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
      ._content[0] = '\0';
      local_98._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      .
      super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
      ._content[1] = '\0';
      local_98._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      .
      super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
      ._content[2] = '\0';
      RealConstantType::RealConstantType(&local_d8,(RealConstantType *)pcVar3);
      operator/(&RStack_f8,(int *)&local_98,&local_d8);
      wrapNumeral<Kernel::RealConstantType>(&local_64,&RStack_f8);
      mpz_clear(RStack_f8.super_RationalConstantType._den._val);
      mpz_clear((__mpz_struct *)&RStack_f8);
      mpz_clear(local_d8.super_RationalConstantType._den._val);
      mpz_clear((__mpz_struct *)&local_d8);
      normalizeMul<Kernel::NumTraits<Kernel::RealConstantType>>
                (&local_98,(Kernel *)&local_64,(NormalizationResult *)this,rhs,simplfied);
      Lib::
      OptionBase<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ::OptionBase(&__return_storage_ptr__->
                    super_OptionBase<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                   ,&local_98);
      Lib::CoproductImpl::TrivialOperations::Destr::
      DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                      *)&local_98);
      Lib::CoproductImpl::TrivialOperations::Destr::
      DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                      *)&local_64);
      return __return_storage_ptr__;
    }
  }
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super_OptionBase<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
           )._elem._elem + 0x1c) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super_OptionBase<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
           )._elem._elem + 0x24) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super_OptionBase<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
           )._elem._elem + 0xc) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super_OptionBase<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
           )._elem._elem + 0x14) = 0;
  *(undefined8 *)
   &__return_storage_ptr__->
    super_OptionBase<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
       = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super_OptionBase<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
           )._elem._elem + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super_OptionBase<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
           )._elem._elem + 0x2c) = 0;
  return __return_storage_ptr__;
}

Assistant:

Option<NormalizationResult> normalizeDiv(NormalizationResult& lhs, NormalizationResult& rhs, bool& simplfied) {
  auto num = rhs.apply(TryNumeral<NumTraits>{});
  if (num.isSome() && *num != 0 ) {
    auto inv = wrapNumeral(1 / *num);
    return Option<NormalizationResult>(normalizeMul<NumTraits>(inv, lhs, simplfied));
  } else {
    return Option<NormalizationResult>();
  }
}